

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn_live.c
# Opt level: O1

void cmn_live_set(cmn_t *cmn,mfcc_t *vec)

{
  int iVar1;
  mfcc_t *pmVar2;
  mfcc_t *pmVar3;
  long lVar4;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn_live.c"
          ,0x37,"Update from < ");
  if (0 < cmn->veclen) {
    lVar4 = 0;
    do {
      err_msg(ERR_INFOCONT,(char *)0x0,0,"%5.2f ",(double)(float)cmn->cmn_mean[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 < cmn->veclen);
  }
  err_msg(ERR_INFOCONT,(char *)0x0,0,">\n");
  iVar1 = cmn->veclen;
  if (0 < (long)iVar1) {
    pmVar2 = cmn->cmn_mean;
    pmVar3 = cmn->sum;
    lVar4 = 0;
    do {
      pmVar2[lVar4] = vec[lVar4];
      pmVar3[lVar4] = (mfcc_t)((float)vec[lVar4] * 500.0);
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  cmn->nframe = 500;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn_live.c"
          ,0x42,"Update to   < ");
  if (0 < cmn->veclen) {
    lVar4 = 0;
    do {
      err_msg(ERR_INFOCONT,(char *)0x0,0,"%5.2f ",(double)(float)cmn->cmn_mean[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 < cmn->veclen);
  }
  err_msg(ERR_INFOCONT,(char *)0x0,0,">\n");
  return;
}

Assistant:

void
cmn_live_set(cmn_t *cmn, mfcc_t const * vec)
{
    int32 i;

    E_INFO("Update from < ");
    for (i = 0; i < cmn->veclen; i++)
        E_INFOCONT("%5.2f ", MFCC2FLOAT(cmn->cmn_mean[i]));
    E_INFOCONT(">\n");

    for (i = 0; i < cmn->veclen; i++) {
        cmn->cmn_mean[i] = vec[i];
        cmn->sum[i] = vec[i] * CMN_WIN;
    }
    cmn->nframe = CMN_WIN;

    E_INFO("Update to   < ");
    for (i = 0; i < cmn->veclen; i++)
        E_INFOCONT("%5.2f ", MFCC2FLOAT(cmn->cmn_mean[i]));
    E_INFOCONT(">\n");
}